

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cpp
# Opt level: O3

void sqlcheck::PrintMessage
               (Configuration *state,string *sql_statement,bool print_statement,
               RiskLevel pattern_risk_level,PatternType pattern_type,string *title,string *message)

{
  bool bVar1;
  size_type sVar2;
  byte bVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  undefined7 in_register_00000011;
  RiskLevel *risk_level;
  RiskLevel *risk_level_00;
  PatternType *pattern_type_00;
  ColorModifier regular;
  ColorModifier regular_1;
  ColorModifier blue;
  ColorModifier green;
  ColorModifier red;
  RiskLevel local_84;
  string local_80;
  ColorModifier local_5c;
  ColorModifier local_54;
  ColorModifier local_4c;
  ColorModifier local_44;
  ColorModifier local_3c;
  PatternType local_34;
  
  bVar3 = state->color_mode;
  local_3c.color_code_ = FG_RED;
  local_3c.enable_bold_ = true;
  local_44.color_code_ = FG_GREEN;
  local_44.enable_bold_ = true;
  local_4c.color_code_ = FG_BLUE;
  local_4c.enable_bold_ = true;
  local_5c.color_code_ = FG_DEFAULT;
  local_5c.enable_bold_ = false;
  local_84 = pattern_risk_level;
  local_5c.enable_color_ = (bool)bVar3;
  local_4c.enable_color_ = (bool)bVar3;
  local_44.enable_color_ = (bool)bVar3;
  local_3c.enable_color_ = (bool)bVar3;
  local_34 = pattern_type;
  if ((int)CONCAT71(in_register_00000011,print_statement) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n-------------------------------------------------\n",0x33);
    bVar1 = state->color_mode;
    local_54.color_code_ = FG_DEFAULT;
    local_54.enable_bold_ = false;
    local_54.enable_color_ = bVar1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SQL Statement at line ",0x16);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    if (bVar1 == true) {
      poVar4 = operator<<(poVar4,&local_3c);
      WrapText(&local_80,sql_statement);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)CONCAT44(local_80._M_dataplus._M_p._4_4_,
                                                  (RiskLevel)local_80._M_dataplus._M_p),
                          local_80._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(state->delimiter)._M_dataplus._M_p,
                          (state->delimiter)._M_string_length);
      poVar4 = operator<<(poVar4,&local_54);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    }
    else {
      WrapText(&local_80,sql_statement);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)CONCAT44(local_80._M_dataplus._M_p._4_4_,
                                                  (RiskLevel)local_80._M_dataplus._M_p),
                          local_80._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(state->delimiter)._M_dataplus._M_p,
                          (state->delimiter)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_80._M_dataplus._M_p._4_4_,(RiskLevel)local_80._M_dataplus._M_p) !=
        &local_80.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_80._M_dataplus._M_p._4_4_,(RiskLevel)local_80._M_dataplus._M_p)
                     );
    }
    bVar3 = state->color_mode;
  }
  sVar2 = (state->file_name)._M_string_length;
  if ((bVar3 & 1) == 0) {
    if (sVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(state->file_name)._M_dataplus._M_p,
                          (state->file_name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]: ",3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
    RiskLevelToString_abi_cxx11_(&local_80,(sqlcheck *)&local_84,risk_level_00);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (char *)CONCAT44(local_80._M_dataplus._M_p._4_4_,
                                         (RiskLevel)local_80._M_dataplus._M_p),
                        local_80._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_80._M_dataplus._M_p._4_4_,(RiskLevel)local_80._M_dataplus._M_p) !=
        &local_80.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_80._M_dataplus._M_p._4_4_,(RiskLevel)local_80._M_dataplus._M_p)
                     );
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
    PatternTypeToString_abi_cxx11_(&local_80,(sqlcheck *)&local_34,pattern_type_00);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (char *)CONCAT44(local_80._M_dataplus._M_p._4_4_,
                                         (RiskLevel)local_80._M_dataplus._M_p),
                        local_80._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_80._M_dataplus._M_p._4_4_,(RiskLevel)local_80._M_dataplus._M_p) !=
        &local_80.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_80._M_dataplus._M_p._4_4_,(RiskLevel)local_80._M_dataplus._M_p)
                     );
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(title->_M_dataplus)._M_p,title->_M_string_length);
  }
  else {
    if (sVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(state->file_name)._M_dataplus._M_p,
                          (state->file_name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]: ",3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
    poVar4 = operator<<((ostream *)&std::cout,&local_44);
    RiskLevelToString_abi_cxx11_(&local_80,(sqlcheck *)&local_84,risk_level);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT44(local_80._M_dataplus._M_p._4_4_,
                                                (RiskLevel)local_80._M_dataplus._M_p),
                        local_80._M_string_length);
    poVar4 = operator<<(poVar4,&local_5c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_80._M_dataplus._M_p._4_4_,(RiskLevel)local_80._M_dataplus._M_p) !=
        &local_80.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_80._M_dataplus._M_p._4_4_,(RiskLevel)local_80._M_dataplus._M_p)
                     );
    }
    poVar4 = operator<<((ostream *)&std::cout,&local_4c);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(title->_M_dataplus)._M_p,title->_M_string_length);
    poVar4 = operator<<(poVar4,&local_5c);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if (state->verbose == true) {
    WrapText(&local_80,message);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (char *)CONCAT44(local_80._M_dataplus._M_p._4_4_,
                                         (RiskLevel)local_80._M_dataplus._M_p),
                        local_80._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_80._M_dataplus._M_p._4_4_,(RiskLevel)local_80._M_dataplus._M_p) !=
        &local_80.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_80._M_dataplus._M_p._4_4_,(RiskLevel)local_80._M_dataplus._M_p)
                     );
    }
  }
  local_80._M_dataplus._M_p._0_4_ = local_84;
  pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](&state->checker_stats,(key_type *)&local_80);
  *pmVar5 = *pmVar5 + 1;
  local_80._M_dataplus._M_p._0_4_ = 0;
  pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](&state->checker_stats,(key_type *)&local_80);
  *pmVar5 = *pmVar5 + 1;
  return;
}

Assistant:

void PrintMessage(Configuration& state,
                  const std::string sql_statement,
                  const bool print_statement,
                  const RiskLevel pattern_risk_level,
                  const PatternType pattern_type,
                  const std::string title,
                  const std::string message){

  ColorModifier red(ColorCode::FG_RED, state.color_mode, true);
  ColorModifier green(ColorCode::FG_GREEN, state.color_mode, true);
  ColorModifier blue(ColorCode::FG_BLUE, state.color_mode, true);
  ColorModifier regular(ColorCode::FG_DEFAULT, state.color_mode, false);

  if(print_statement == true){
    std::cout << "\n-------------------------------------------------\n";
    ColorModifier regular(ColorCode::FG_DEFAULT, state.color_mode, false);

    if(state.color_mode == true){
      std::cout << "SQL Statement at line " << state.line_number <<": " << red << WrapText(sql_statement) << state.delimiter << regular << "\n";
    }
    else {
      std::cout << "SQL Statement at line " << state.line_number << ": " << WrapText(sql_statement) << state.delimiter << "\n";
    }
  }

  if(state.color_mode == true){
    if(state.file_name.empty() == false){
      std::cout << "[" << state.file_name << "]: ";
    }

    std::cout << "(" << green << RiskLevelToString(pattern_risk_level) << regular << ") ";
    std::cout << blue << title << regular << "\n";
  }
  else {
    if(state.file_name.empty() == false){
      std::cout << "[" << state.file_name << "]: ";
    }

    std::cout << "(" << RiskLevelToString(pattern_risk_level) << ") ";
    std::cout << "(" << PatternTypeToString(pattern_type) << ") ";
    std::cout << title << "\n";
  }

  // Print detailed message only in verbose mode
  if(state.verbose == true){
    std::cout << WrapText(message) << "\n";
  }

  // Update checker stats
  state.checker_stats[pattern_risk_level]++;
  state.checker_stats[RISK_LEVEL_ALL]++;

}